

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_substitute.c
# Opt level: O2

int find_text_end(pcre2_code_16 *code,PCRE2_SPTR16 *ptrptr,PCRE2_SPTR16 ptrend,BOOL last)

{
  PCRE2_SPTR16 pPVar1;
  PCRE2_UCHAR16 PVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  PCRE2_SPTR16 local_50;
  int local_48;
  int errorcode;
  PCRE2_SPTR16 *local_40;
  uint32_t ch;
  
  local_50 = *ptrptr;
  pPVar1 = ptrend + -1;
  iVar6 = 0;
  bVar3 = false;
  local_40 = ptrptr;
  do {
    iVar5 = -0x3a;
    if (ptrend <= local_50) {
LAB_0014f5eb:
      *local_40 = local_50;
      return iVar5;
    }
    PVar2 = *local_50;
    if (bVar3) {
      if ((local_50 < pPVar1 && PVar2 == 0x5c) && (local_50[1] == 0x45)) {
LAB_0014f4cb:
        local_50 = local_50 + 1;
        goto LAB_0014f4e8;
      }
LAB_0014f5de:
      bVar3 = true;
    }
    else {
      if (PVar2 == 0x7d) {
        if (iVar6 == 0) {
LAB_0014f5e9:
          iVar5 = 0;
          goto LAB_0014f5eb;
        }
        iVar6 = iVar6 + -1;
      }
      else {
        if ((PVar2 == 0x3a && last == 0) && iVar6 == 0) goto LAB_0014f5e9;
        if (PVar2 != 0x5c) {
          bVar3 = false;
          if (((PVar2 == 0x24) && (local_50 < pPVar1)) && (bVar3 = false, local_50[1] == 0x7b)) {
            local_50 = local_50 + 1;
            iVar6 = iVar6 + 1;
          }
          goto LAB_0014f5e0;
        }
        if (((local_50 < pPVar1) && (local_50[1] - 0x4c < 0x2a)) &&
           ((0x20100000201U >> ((ulong)(local_50[1] - 0x4c) & 0x3f) & 1) != 0)) goto LAB_0014f4cb;
        local_50 = local_50 + 1;
        local_48 = last;
        iVar4 = _pcre2_check_escape_16
                          (&local_50,ptrend,&ch,&errorcode,code->overall_options,0,
                           (compile_block_16 *)0x0);
        local_50 = local_50 + -1;
        iVar5 = errorcode;
        if (errorcode != 0) goto LAB_0014f5eb;
        last = local_48;
        if (iVar4 != 0) {
          if (iVar4 == 0x1a) goto LAB_0014f5de;
          if (iVar4 != 0x19) {
            iVar5 = -0x39;
            goto LAB_0014f5eb;
          }
        }
      }
LAB_0014f4e8:
      bVar3 = false;
    }
LAB_0014f5e0:
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

static int
find_text_end(const pcre2_code *code, PCRE2_SPTR *ptrptr, PCRE2_SPTR ptrend,
  BOOL last)
{
int rc = 0;
uint32_t nestlevel = 0;
BOOL literal = FALSE;
PCRE2_SPTR ptr = *ptrptr;

for (; ptr < ptrend; ptr++)
  {
  if (literal)
    {
    if (ptr[0] == CHAR_BACKSLASH && ptr < ptrend - 1 && ptr[1] == CHAR_E)
      {
      literal = FALSE;
      ptr += 1;
      }
    }

  else if (*ptr == CHAR_RIGHT_CURLY_BRACKET)
    {
    if (nestlevel == 0) goto EXIT;
    nestlevel--;
    }

  else if (*ptr == CHAR_COLON && !last && nestlevel == 0) goto EXIT;

  else if (*ptr == CHAR_DOLLAR_SIGN)
    {
    if (ptr < ptrend - 1 && ptr[1] == CHAR_LEFT_CURLY_BRACKET)
      {
      nestlevel++;
      ptr += 1;
      }
    }

  else if (*ptr == CHAR_BACKSLASH)
    {
    int erc;
    int errorcode;
    uint32_t ch;

    if (ptr < ptrend - 1) switch (ptr[1])
      {
      case CHAR_L:
      case CHAR_l:
      case CHAR_U:
      case CHAR_u:
      ptr += 1;
      continue;
      }

    ptr += 1;  /* Must point after \ */
    erc = PRIV(check_escape)(&ptr, ptrend, &ch, &errorcode,
      code->overall_options, FALSE, NULL);
    ptr -= 1;  /* Back to last code unit of escape */
    if (errorcode != 0)
      {
      rc = errorcode;
      goto EXIT;
      }

    switch(erc)
      {
      case 0:      /* Data character */
      case ESC_E:  /* Isolated \E is ignored */
      break;

      case ESC_Q:
      literal = TRUE;
      break;

      default:
      rc = PCRE2_ERROR_BADREPESCAPE;
      goto EXIT;
      }
    }
  }

rc = PCRE2_ERROR_REPMISSINGBRACE;   /* Terminator not found */

EXIT:
*ptrptr = ptr;
return rc;
}